

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void pick_sb_modes_nonrd(AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,int mi_row,int mi_col,
                        RD_STATS *rd_cost,BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx)

{
  uint8_t uVar1;
  AQ_MODE aq_mode;
  ushort uVar2;
  int iVar3;
  int iVar4;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO **ppMVar5;
  MB_MODE_INFO *pMVar6;
  int64_t iVar7;
  uint uVar8;
  int iVar9;
  SequenceHeader *pSVar10;
  tran_low_t **pptVar11;
  YV12_BUFFER_CONFIG *src;
  long lVar12;
  int iVar13;
  ulong uVar14;
  scale_factors *scale;
  ulong uVar15;
  long lVar16;
  int *piVar17;
  buf_2d *pbVar18;
  ushort uVar19;
  int iVar20;
  char cVar21;
  ulong uVar22;
  ulong uVar23;
  buf_2d *dst;
  bool bVar24;
  bool bVar25;
  uint thresh_exit_part [3];
  buf_2d local_98 [3];
  
  pSVar10 = (cpi->common).seq_params;
  uVar14 = (ulong)bsize;
  if ((pSVar10->sb_size != bsize) || ((cpi->sf).rt_sf.nonrd_check_partition_split == 1)) {
    av1_set_offsets(cpi,&tile_data->tile_info,x,mi_row,mi_col,bsize);
    pSVar10 = (cpi->common).seq_params;
  }
  uVar1 = pSVar10->monochrome;
  mbmi = *(x->e_mbd).mi;
  if ((cpi->common).seg.enabled == '\0') {
    bVar24 = true;
  }
  else {
    bVar24 = ((cpi->common).seg.feature_mask[*(ushort *)&mbmi->field_0xa7 & 7] & 0x40) == 0;
  }
  aq_mode = (cpi->oxcf).q_cfg.aq_mode;
  wait_for_top_right_sb
            (&(cpi->mt_info).enc_row_mt,&tile_data->row_mt_sync,&tile_data->tile_info,
             pSVar10->sb_size,pSVar10->mib_size_log2,bsize,mi_row,mi_col);
  pptVar11 = ctx->coeff;
  (x->e_mbd).tx_type_map = (x->txfm_search_info).tx_type_map_;
  (x->e_mbd).tx_type_map_stride =
       (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar14];
  lVar12 = 0x11;
  if (uVar1 == '\0') {
    lVar12 = 0x33;
  }
  for (lVar16 = 0; lVar12 != lVar16; lVar16 = lVar16 + 0x11) {
    (&x->plane[0].coeff)[lVar16] = *pptVar11;
    (&x->plane[0].qcoeff)[lVar16] = pptVar11[3];
    (&x->plane[0].dqcoeff)[lVar16] = pptVar11[6];
    (&x->plane[0].eobs)[lVar16] = (uint16_t *)pptVar11[9];
    (&x->plane[0].txb_entropy_ctx)[lVar16] = (uint8_t *)pptVar11[0xc];
    pptVar11 = pptVar11 + 1;
  }
  (x->e_mbd).plane[0].color_index_map = ctx->color_index_map[0];
  (x->e_mbd).plane[1].color_index_map = ctx->color_index_map[1];
  if (bVar24) {
    uVar8 = x->force_zeromv_skip_for_sb;
    if ((int)uVar8 < 2) {
LAB_001cdb1a:
      x->force_zeromv_skip_for_blk = uVar8;
      if (uVar8 != 0) goto LAB_001cdb63;
    }
    else {
      pSVar10 = (cpi->common).seq_params;
      if (pSVar10->sb_size != bsize) {
        bVar25 = pSVar10->monochrome == '\0';
        uVar8 = bVar25 + 1 + (uint)bVar25;
        uVar22 = (ulong)uVar8;
        thresh_exit_part[0] = cpi->zeromv_skip_thresh_exit_part[uVar14];
        thresh_exit_part[1] = thresh_exit_part[0] * 3 >> 2;
        thresh_exit_part[2] = thresh_exit_part[1];
        src = get_ref_frame_yv12_buf(&cpi->common,'\x01');
        iVar3 = (cpi->common).remapped_ref_idx[0];
        scale = (scale_factors *)0x0;
        if (iVar3 != -1) {
          scale = (cpi->common).ref_scale_factors + iVar3;
        }
        dst = local_98;
        av1_setup_pred_block(&x->e_mbd,dst,src,scale,scale,uVar8);
        pbVar18 = &x->plane[0].src;
        piVar17 = &(x->e_mbd).plane[0].subsampling_y;
        uVar23 = 0xffffffffffffffff;
        do {
          uVar15 = uVar22;
          if (uVar23 - uVar22 == -1) break;
          uVar8 = (*cpi->ppi->fn_ptr[av1_ss_size_lookup[uVar14][piVar17[-1]][*piVar17]].sdf)
                            (pbVar18->buf,pbVar18->stride,dst->buf,dst->stride);
          uVar15 = uVar23 + 1;
          dst = dst + 1;
          pbVar18 = (buf_2d *)((long)(pbVar18 + 4) + 8);
          piVar17 = piVar17 + 0x28c;
          lVar12 = uVar23 + 1;
          uVar23 = uVar15;
        } while (uVar8 < thresh_exit_part[lVar12]);
        uVar8 = (uint)(uVar22 <= uVar15);
        goto LAB_001cdb1a;
      }
      x->force_zeromv_skip_for_blk = 0;
    }
    if ((x->source_variance == 0xffffffff) || (bsize < ((cpi->common).seq_params)->sb_size)) {
      uVar8 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,&x->plane[0].src,bsize,0);
      x->source_variance = uVar8;
    }
  }
LAB_001cdb63:
  iVar3 = x->rdmult;
  setup_block_rdmult(cpi,x,mi_row,mi_col,bsize,aq_mode,mbmi);
  iVar9 = x->rdmult >> 6;
  iVar13 = 1;
  if (1 < iVar9) {
    iVar13 = iVar9;
  }
  x->errorperbit = iVar13;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    lVar12 = (long)(cpi->sf).rt_sf.hybrid_intra_pickmode;
    if ((bsize < BLOCK_16X16 && lVar12 != 0) &&
       (*(uint *)(partition_context_lookup + lVar12 * 2 + 0x14) <= x->source_variance)) {
      av1_rd_pick_intra_mode_sb(cpi,x,rd_cost,bsize,ctx,0x7fffffffffffffff);
    }
    else {
      av1_nonrd_pick_intra_mode(cpi,x,rd_cost,bsize,ctx);
    }
  }
  else {
    if (!bVar24) {
      x->force_zeromv_skip_for_blk = 1;
    }
    av1_nonrd_pick_inter_mode_sb(cpi,tile_data,x,rd_cost,bsize,ctx);
  }
  iVar13 = (cpi->sf).rt_sf.skip_cdef_sb;
  if (iVar13 == 0) goto LAB_001cddb4;
  bVar25 = true;
  if (bVar24) {
    if ((((cpi->rc).frames_since_key < 0xb) || ((cpi->rc).high_source_sad != 0)) ||
       (x->color_sensitivity[0] != '\0')) {
      bVar25 = false;
    }
    else {
      bVar25 = x->color_sensitivity[1] == '\0';
    }
  }
  ppMVar5 = (cpi->common).mi_params.mi_grid_base;
  iVar20 = (mi_row - mi_row % 0x10) * (cpi->common).mi_params.mi_stride + (mi_col - mi_col % 0x10);
  iVar9 = (cpi->common).width;
  iVar4 = (cpi->common).height;
  if (iVar9 < iVar4) {
    iVar4 = iVar9;
  }
  uVar8 = 0xffffffff;
  if ((10 < (cpi->oxcf).speed) && (iVar4 < 0x2d0)) {
    uVar8 = -(uint)((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) | 400;
  }
  pMVar6 = ppMVar5[iVar20];
  uVar2 = *(ushort *)&pMVar6->field_0xa7;
  cVar21 = (char)((uint)(int)(short)(uVar2 * 2) >> 0xc);
  if (iVar13 < 2) {
    if ((bool)(cVar21 != '\0' & bVar25)) {
      uVar19 = 0x800;
      if (uVar8 <= x->source_variance) goto LAB_001cdd7d;
      if (0xc < mbmi->mode) {
        uVar19 = (ushort)(mbmi->mode != 0x10);
        goto LAB_001cdd7a;
      }
    }
    uVar19 = 0;
  }
  else {
    if ((bool)(cVar21 == '\0' | bVar25)) {
      uVar19 = (ushort)(cVar21 != '\0');
    }
    else {
      uVar19 = (ushort)(x->source_variance == 0);
    }
LAB_001cdd7a:
    uVar19 = uVar19 << 0xb;
  }
LAB_001cdd7d:
  *(ushort *)&pMVar6->field_0xa7 = uVar19 | uVar2 & 0x87ff;
  *(ushort *)&(ctx->mic).field_0xa7 =
       *(ushort *)&(ctx->mic).field_0xa7 & 0x87ff | *(ushort *)&ppMVar5[iVar20]->field_0xa7 & 0x7800
  ;
LAB_001cddb4:
  x->rdmult = iVar3;
  (ctx->rd_stats).rate = rd_cost->rate;
  iVar7 = rd_cost->rdcost;
  (ctx->rd_stats).dist = rd_cost->dist;
  (ctx->rd_stats).rdcost = iVar7;
  return;
}

Assistant:

static void pick_sb_modes_nonrd(AV1_COMP *const cpi, TileDataEnc *tile_data,
                                MACROBLOCK *const x, int mi_row, int mi_col,
                                RD_STATS *rd_cost, BLOCK_SIZE bsize,
                                PICK_MODE_CONTEXT *ctx) {
  // For nonrd mode, av1_set_offsets is already called at the superblock level
  // in encode_nonrd_sb when we determine the partitioning.
  if (bsize != cpi->common.seq_params->sb_size ||
      cpi->sf.rt_sf.nonrd_check_partition_split == 1) {
    av1_set_offsets(cpi, &tile_data->tile_info, x, mi_row, mi_col, bsize);
  }
  assert(x->last_set_offsets_loc.mi_row == mi_row &&
         x->last_set_offsets_loc.mi_col == mi_col &&
         x->last_set_offsets_loc.bsize == bsize);
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  struct macroblock_plane *const p = x->plane;
  struct macroblockd_plane *const pd = xd->plane;
  const AQ_MODE aq_mode = cpi->oxcf.q_cfg.aq_mode;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  int i;
  const int seg_skip =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP);

  // This is only needed for real time/allintra row-mt enabled multi-threaded
  // encoding with cost update frequency set to COST_UPD_TILE/COST_UPD_OFF.
  wait_for_top_right_sb(&cpi->mt_info.enc_row_mt, &tile_data->row_mt_sync,
                        &tile_data->tile_info, cm->seq_params->sb_size,
                        cm->seq_params->mib_size_log2, bsize, mi_row, mi_col);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, pick_sb_modes_nonrd_time);
#endif
  // Sets up the tx_type_map buffer in MACROBLOCKD.
  xd->tx_type_map = txfm_info->tx_type_map_;
  xd->tx_type_map_stride = mi_size_wide[bsize];
  for (i = 0; i < num_planes; ++i) {
    p[i].coeff = ctx->coeff[i];
    p[i].qcoeff = ctx->qcoeff[i];
    p[i].dqcoeff = ctx->dqcoeff[i];
    p[i].eobs = ctx->eobs[i];
    p[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
  }
  for (i = 0; i < 2; ++i) pd[i].color_index_map = ctx->color_index_map[i];

  if (!seg_skip) {
    x->force_zeromv_skip_for_blk =
        get_force_zeromv_skip_flag_for_blk(cpi, x, bsize);

    // Source variance may be already compute at superblock level, so no need
    // to recompute, unless bsize < sb_size or source_variance is not yet set.
    if (!x->force_zeromv_skip_for_blk &&
        (x->source_variance == UINT_MAX || bsize < cm->seq_params->sb_size))
      x->source_variance = av1_get_perpixel_variance_facade(
          cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, aq_mode, mbmi);
  // Set error per bit for current rdmult
  av1_set_error_per_bit(&x->errorperbit, x->rdmult);
  // Find best coding mode & reconstruct the MB so it is available
  // as a predictor for MBs that follow in the SB
  if (frame_is_intra_only(cm)) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, hybrid_intra_mode_search_time);
#endif
    hybrid_intra_mode_search(cpi, x, rd_cost, bsize, ctx);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, hybrid_intra_mode_search_time);
#endif
  } else {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, nonrd_pick_inter_mode_sb_time);
#endif
    if (seg_skip) {
      x->force_zeromv_skip_for_blk = 1;
      // TODO(marpan): Consider adding a function for nonrd:
      // av1_nonrd_pick_inter_mode_sb_seg_skip(), instead of setting
      // x->force_zeromv_skip flag and entering av1_nonrd_pick_inter_mode_sb().
    }
    av1_nonrd_pick_inter_mode_sb(cpi, tile_data, x, rd_cost, bsize, ctx);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, nonrd_pick_inter_mode_sb_time);
#endif
  }
  if (cpi->sf.rt_sf.skip_cdef_sb) {
    // cdef_strength is initialized to 1 which means skip_cdef, and is updated
    // here. Check to see is skipping cdef is allowed. Never skip on slide/scene
    // change, near a key frame, or when color sensitivity is set. Always allow
    // cdef_skip for seg_skip = 1.
    const int allow_cdef_skipping =
        seg_skip ||
        (cpi->rc.frames_since_key > 10 && !cpi->rc.high_source_sad &&
         !(x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] ||
           x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]));

    // Find the corresponding 64x64 block. It'll be the 128x128 block if that's
    // the block size.
    const int mi_row_sb = mi_row - mi_row % MI_SIZE_64X64;
    const int mi_col_sb = mi_col - mi_col % MI_SIZE_64X64;
    MB_MODE_INFO **mi_sb =
        cm->mi_params.mi_grid_base +
        get_mi_grid_idx(&cm->mi_params, mi_row_sb, mi_col_sb);
    const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
    unsigned int thresh_spatial_var =
        (cpi->oxcf.speed >= 11 && !is_720p_or_larger &&
         cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN)
            ? 400
            : UINT_MAX;
    // For skip_cdef_sb = 1: do not skip if allow_cdef_skipping is false or
    // intra or new mv is picked, with possible conidition on spatial variance.
    // For skip_cdef_sb >= 2: more aggressive mode to always skip unless
    // allow_cdef_skipping is false and source_variance is non-zero.
    if (cpi->sf.rt_sf.skip_cdef_sb >= 2) {
      mi_sb[0]->cdef_strength =
          mi_sb[0]->cdef_strength &&
          (allow_cdef_skipping || x->source_variance == 0);
    } else {
      mi_sb[0]->cdef_strength =
          mi_sb[0]->cdef_strength && allow_cdef_skipping &&
          !(x->source_variance < thresh_spatial_var &&
            (mbmi->mode < INTRA_MODES || mbmi->mode == NEWMV));
    }
    // Store in the pickmode context.
    ctx->mic.cdef_strength = mi_sb[0]->cdef_strength;
  }
  x->rdmult = orig_rdmult;
  ctx->rd_stats.rate = rd_cost->rate;
  ctx->rd_stats.dist = rd_cost->dist;
  ctx->rd_stats.rdcost = rd_cost->rdcost;
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, pick_sb_modes_nonrd_time);
#endif
}